

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O3

void mdef_free(mdef_t *m)

{
  void *ptr;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (m != (mdef_t *)0x0) {
    if (m->sen2cimap != (int16 *)0x0) {
      ckd_free(m->sen2cimap);
    }
    if (m->cd2cisen != (int16 *)0x0) {
      ckd_free(m->cd2cisen);
    }
    iVar1 = m->n_ciphone;
    lVar2 = 0;
    do {
      if (0 < iVar1) {
        lVar3 = 0;
        do {
          if (m->wpos_ci_lclist[lVar2][lVar3] != (ph_lc_t *)0x0) {
            mdef_free_recursive_lc(m->wpos_ci_lclist[lVar2][lVar3]->next);
            mdef_free_recursive_rc(m->wpos_ci_lclist[lVar2][lVar3]->rclist);
            iVar1 = m->n_ciphone;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    lVar2 = 0;
    do {
      if (0 < iVar1) {
        lVar3 = 0;
        do {
          if (m->wpos_ci_lclist[lVar2][lVar3] != (ph_lc_t *)0x0) {
            ckd_free(m->wpos_ci_lclist[lVar2][lVar3]);
            iVar1 = m->n_ciphone;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar1);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    if (m->wpos_ci_lclist != (ph_lc_t ***)0x0) {
      ckd_free_2d(m->wpos_ci_lclist);
    }
    if (m->sseq != (uint16 **)0x0) {
      ckd_free_2d(m->sseq);
    }
    if (m->phone != (phone_t *)0x0) {
      ckd_free(m->phone);
    }
    if (m->ciphone_ht != (hash_table_t *)0x0) {
      hash_table_free(m->ciphone_ht);
    }
    iVar1 = m->n_ciphone;
    if (0 < iVar1) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        ptr = *(void **)((long)&m->ciphone->name + lVar2);
        if (ptr != (void *)0x0) {
          ckd_free(ptr);
          iVar1 = m->n_ciphone;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar3 < iVar1);
    }
    if (m->ciphone != (ciphone_t *)0x0) {
      ckd_free(m->ciphone);
    }
    ckd_free(m);
    return;
  }
  return;
}

Assistant:

void
mdef_free(mdef_t * m)
{
    int i, j;

    if (m) {
        if (m->sen2cimap)
            ckd_free((void *) m->sen2cimap);
        if (m->cd2cisen)
            ckd_free((void *) m->cd2cisen);

        /* RAH, go down the ->next list and delete all the pieces */
        for (i = 0; i < N_WORD_POSN; i++)
            for (j = 0; j < m->n_ciphone; j++)
                if (m->wpos_ci_lclist[i][j]) {
                    mdef_free_recursive_lc(m->wpos_ci_lclist[i][j]->next);
                    mdef_free_recursive_rc(m->wpos_ci_lclist[i][j]->
                                           rclist);
                }

        for (i = 0; i < N_WORD_POSN; i++)
            for (j = 0; j < m->n_ciphone; j++)
                if (m->wpos_ci_lclist[i][j])
                    ckd_free((void *) m->wpos_ci_lclist[i][j]);


        if (m->wpos_ci_lclist)
            ckd_free_2d((void *) m->wpos_ci_lclist);
        if (m->sseq)
            ckd_free_2d((void *) m->sseq);
        /* Free phone context */
        if (m->phone)
            ckd_free((void *) m->phone);
        if (m->ciphone_ht)
            hash_table_free(m->ciphone_ht);

        for (i = 0; i < m->n_ciphone; i++) {
            if (m->ciphone[i].name)
                ckd_free((void *) m->ciphone[i].name);
        }


        if (m->ciphone)
            ckd_free((void *) m->ciphone);

        ckd_free((void *) m);
    }
}